

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::ExtPrivkey::DerivePubkeyData
          (KeyData *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  Pubkey local_c0;
  undefined1 local_a8 [8];
  ByteData fingerprint;
  ExtPubkey key;
  string *string_path_local;
  ExtPrivkey *this_local;
  
  DerivePubkey((ExtPubkey *)
               &fingerprint.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this,string_path);
  Privkey::GeneratePubkey(&local_c0,&this->privkey_,true);
  Pubkey::GetFingerprint((ByteData *)local_a8,&local_c0,4);
  Pubkey::~Pubkey(&local_c0);
  KeyData::KeyData(__return_storage_ptr__,
                   (ExtPubkey *)
                   &fingerprint.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,string_path,(ByteData *)local_a8);
  ByteData::~ByteData((ByteData *)local_a8);
  ExtPubkey::~ExtPubkey
            ((ExtPubkey *)
             &fingerprint.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

KeyData ExtPrivkey::DerivePubkeyData(const std::string& string_path) const {
  ExtPubkey key = DerivePubkey(string_path);
  auto fingerprint = privkey_.GeneratePubkey().GetFingerprint();
  return KeyData(key, string_path, fingerprint);
}